

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS
ref_facelift_gradation_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  uint uVar5;
  REF_DBL *pRVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  REF_DBL current_complexity;
  double local_60;
  REF_DBL local_58;
  REF_DBL local_48;
  
  pRVar2 = ref_grid->node;
  local_48 = gradation;
  if (gradation <= -gradation) {
    local_48 = -gradation;
  }
  iVar9 = 0;
  local_58 = gradation;
  while( true ) {
    uVar4 = ref_facelift_complexity(metric,ref_grid,&local_60);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x555,"ref_facelift_gradation_at_complexity",(ulong)uVar4,"cmp");
      return uVar4;
    }
    dVar10 = local_60 * 1e+20;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    uVar4 = 4;
    if (dVar10 <= local_48) break;
    iVar1 = pRVar2->max;
    if (0 < (long)iVar1) {
      pRVar3 = pRVar2->global;
      lVar7 = 0;
      pRVar6 = metric;
      do {
        if (-1 < pRVar3[lVar7]) {
          lVar8 = 0;
          do {
            dVar10 = (pRVar6 + lVar8)[1];
            pRVar6[lVar8] = pRVar6[lVar8] * (local_58 / local_60);
            (pRVar6 + lVar8)[1] = dVar10 * (local_58 / local_60);
            lVar8 = lVar8 + 2;
          } while (lVar8 != 6);
        }
        lVar7 = lVar7 + 1;
        pRVar6 = pRVar6 + 6;
      } while (lVar7 != iVar1);
    }
    uVar5 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x561,"ref_facelift_gradation_at_complexity",(ulong)uVar5,"gradation");
      return uVar5;
    }
    iVar9 = iVar9 + 1;
    if (iVar9 == 0x14) {
      uVar5 = ref_facelift_complexity(metric,ref_grid,&local_60);
      if (uVar5 == 0) {
        dVar10 = local_60 * 1e+20;
        if (dVar10 <= -dVar10) {
          dVar10 = -dVar10;
        }
        if (local_48 < dVar10) {
          iVar9 = pRVar2->max;
          if ((long)iVar9 < 1) {
            uVar4 = 0;
          }
          else {
            pRVar3 = pRVar2->global;
            lVar7 = 0;
            uVar4 = 0;
            do {
              if (-1 < pRVar3[lVar7]) {
                lVar8 = 0;
                do {
                  dVar10 = (metric + lVar8)[1];
                  metric[lVar8] = metric[lVar8] * (local_58 / local_60);
                  (metric + lVar8)[1] = dVar10 * (local_58 / local_60);
                  lVar8 = lVar8 + 2;
                } while (lVar8 != 6);
              }
              lVar7 = lVar7 + 1;
              metric = metric + 6;
            } while (lVar7 != iVar9);
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x567,"ref_facelift_gradation_at_complexity",(ulong)uVar5,"cmp");
        uVar4 = uVar5;
      }
      return uVar4;
    }
  }
  return 4;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_gradation_at_complexity(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL gradation, REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;

  complexity_scale = 1.0; /* "2D" along surf */

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_facelift_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
    }
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
  }
  RSS(ref_facelift_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
  }

  return REF_SUCCESS;
}